

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O2

uint64_t interpolative_internal::read_center_mid(bit_stream *is,uint64_t u)

{
  uint64_t uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (u == 1) {
    uVar5 = 1;
    uVar4 = uVar5;
  }
  else {
    lVar2 = 1L << ((ulong)(byte)-(char)LZCOUNT(u - 1) & 0x3f);
    uVar4 = u * 2 - lVar2;
    uVar3 = lVar2 - u;
    uVar1 = bit_stream::get_int(is,LZCOUNT(u - 1) ^ 0x3f);
    uVar5 = uVar1 + 1;
    if (uVar3 < uVar5) {
      uVar1 = bit_stream::get_int(is,1);
      uVar5 = ~uVar3 + uVar5 * 2 + uVar1;
    }
  }
  uVar5 = (uVar4 >> 1) + uVar5;
  uVar1 = 0;
  if (u < uVar5) {
    uVar1 = u;
  }
  return uVar5 - uVar1;
}

Assistant:

static inline uint64_t read_center_mid(bit_stream& is, uint64_t u)
    {
        auto b = u == 1ULL ? 0ULL : bits::hi(u - 1ULL) + 1ULL;
        auto d = 2ULL * u - (1ULL << b);
        uint64_t val = 1ULL;
        if (u != 1) {
            uint64_t m = (1ULL << b) - u;
            val = is.get_int(b - 1) + 1;
            if (val > m) {
                val = (2ULL * val + is.get_int(1)) - m - 1ULL;
            }
        }
        val = val + (d >> 1ULL);
        if (val > u)
            val -= u;
        return val;
    }